

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMappingSparseMapped.h
# Opt level: O2

void __thiscall
RewardModelMappingSparseMapped::Set
          (RewardModelMappingSparseMapped *this,Index s_i,Index ja_i,double rew)

{
  undefined1 auVar1 [16];
  SparseMatrix *this_00;
  ulong i;
  ulong j;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  double local_48;
  sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_40;
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = rew;
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar2 = vandpd_avx512vl(auVar4._0_16_,auVar2);
  this_00 = &this->_m_R;
  i = (ulong)s_i;
  j = (ulong)ja_i;
  local_48 = rew;
  local_40.
  super_container_reference<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  .c_ = this_00;
  local_40.i_ = i;
  local_40.j_ = j;
  if (auVar2._0_8_ <= 1e-12) {
    boost::numeric::ublas::
    sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::get_d(&local_40);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_40.d_;
    auVar1._8_8_ = 0x7fffffffffffffff;
    auVar1._0_8_ = 0x7fffffffffffffff;
    auVar2 = vandpd_avx512vl(auVar3,auVar1);
    if (1e-12 < auVar2._0_8_) {
      boost::numeric::ublas::
      mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
      ::erase_element(this_00,i,j);
    }
  }
  else {
    boost::numeric::ublas::
    sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::set(&local_40,&local_48);
  }
  return;
}

Assistant:

void Set(Index s_i, Index ja_i, double rew)
        {
            // make sure reward is not 0
            if(fabs(rew) > REWARD_PRECISION)
                _m_R(s_i,ja_i)=rew;
            // check if we already defined this element, if so remove it
            else if(fabs(_m_R(s_i,ja_i))>REWARD_PRECISION)
                _m_R.erase_element(s_i,ja_i);

        }